

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslTokenStream.cpp
# Opt level: O0

void __thiscall glslang::HlslTokenStream::advanceToken(HlslTokenStream *this)

{
  int iVar1;
  vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_> *this_00;
  size_type sVar2;
  reference pvVar3;
  reference ppTVar4;
  const_reference __src;
  HlslToken local_38;
  HlslTokenStream *local_10;
  HlslTokenStream *this_local;
  
  local_10 = this;
  pushTokenBuffer(this,&this->token);
  if (this->preTokenStackSize < 1) {
    sVar2 = std::
            vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
            ::size(&(this->tokenStreamStack).
                    super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
                  );
    if (sVar2 == 0) {
      HlslScanContext::tokenize(this->scanner,&this->token);
    }
    else {
      pvVar3 = std::vector<int,_glslang::pool_allocator<int>_>::back
                         (&(this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>);
      *pvVar3 = *pvVar3 + 1;
      pvVar3 = std::vector<int,_glslang::pool_allocator<int>_>::back
                         (&(this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>);
      iVar1 = *pvVar3;
      ppTVar4 = std::
                vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
                ::back(&(this->tokenStreamStack).
                        super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
                      );
      sVar2 = std::vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>::size
                        (&(*ppTVar4)->
                          super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>
                        );
      if (iVar1 < (int)sVar2) {
        ppTVar4 = std::
                  vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
                  ::back(&(this->tokenStreamStack).
                          super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
                        );
        this_00 = &(*ppTVar4)->
                   super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>;
        pvVar3 = std::vector<int,_glslang::pool_allocator<int>_>::back
                           (&(this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>)
        ;
        __src = std::vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>::
                operator[](this_00,(long)*pvVar3);
        memcpy(&this->token,__src,0x28);
      }
      else {
        (this->token).tokenClass = EHTokNone;
      }
    }
  }
  else {
    popPreToken(&local_38,this);
    memcpy(&this->token,&local_38,0x28);
  }
  return;
}

Assistant:

void HlslTokenStream::advanceToken()
{
    pushTokenBuffer(token);
    if (preTokenStackSize > 0)
        token = popPreToken();
    else {
        if (tokenStreamStack.size() == 0)
            scanner.tokenize(token);
        else {
            ++tokenPosition.back();
            if (tokenPosition.back() >= (int)tokenStreamStack.back()->size())
                token.tokenClass = EHTokNone;
            else
                token = (*tokenStreamStack.back())[tokenPosition.back()];
        }
    }
}